

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

double bsc_g(bsc_request_t type,int word_size)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  if ((s_g[0] == 0.0) && (!NAN(s_g[0]))) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      dVar3 = load_param((char *)((long)&DAT_00117110 + (long)*(int *)((long)&DAT_00117110 + lVar1))
                         ,1.0,"bsc_g");
      *(double *)((long)s_g + lVar2) = dVar3;
      dVar3 = load_param((char *)((long)&DAT_00117124 + (long)*(int *)((long)&DAT_00117124 + lVar1))
                         ,0.0,"bsc_g");
      *(double *)((long)s_o + lVar2) = dVar3;
      lVar1 = lVar1 + 4;
      lVar2 = lVar2 + 8;
    } while (lVar1 != 0x14);
  }
  return s_o[type] / (double)word_size + s_g[type];
}

Assistant:

double bsc_g(bsc_request_t type, int word_size)
{
    if ( s_g[0] == 0.0 ) {
        load_param_g_once();
    }
    return s_g[type] + s_o[type] / word_size;
}